

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O1

void MergeMatches(BackwardMatch *dst,BackwardMatch *src1,size_t len1,BackwardMatch *src2,size_t len2
                 )

{
  BackwardMatch BVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  
  if (len2 != 0 && len1 != 0) {
    do {
      uVar2 = src1->length_and_code >> 5;
      uVar4 = src2->length_and_code >> 5;
      if ((uVar2 < uVar4) || ((uVar2 == uVar4 && (src1->distance < src2->distance)))) {
        BVar1 = *src1;
        src1 = src1 + 1;
        *dst = BVar1;
        len1 = len1 - 1;
      }
      else {
        BVar1 = *src2;
        src2 = src2 + 1;
        *dst = BVar1;
        len2 = len2 - 1;
      }
      dst = dst + 1;
    } while ((len1 != 0) && (len2 != 0));
  }
  if (len1 != 0) {
    sVar3 = 0;
    do {
      *dst = src1[sVar3];
      dst = dst + 1;
      sVar3 = sVar3 + 1;
    } while (len1 != sVar3);
  }
  if (len2 != 0) {
    sVar3 = 0;
    do {
      dst[sVar3] = src2[sVar3];
      sVar3 = sVar3 + 1;
    } while (len2 != sVar3);
  }
  return;
}

Assistant:

static void MergeMatches(BackwardMatch* dst,
    BackwardMatch* src1, size_t len1, BackwardMatch* src2, size_t len2) {
  while (len1 > 0 && len2 > 0) {
    size_t l1 = BackwardMatchLength(src1);
    size_t l2 = BackwardMatchLength(src2);
    if (l1 < l2 || ((l1 == l2) && (src1->distance < src2->distance))) {
      *dst++ = *src1++;
      len1--;
    } else {
      *dst++ = *src2++;
      len2--;
    }
  }
  while (len1-- > 0) *dst++ = *src1++;
  while (len2-- > 0) *dst++ = *src2++;
}